

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::Matcher<unsigned_long_long>::Matcher
          (Matcher<unsigned_long_long> *this,unsigned_long_long value)

{
  Matcher<unsigned_long_long> *in_RDI;
  Matcher<unsigned_long_long> *in_stack_ffffffffffffffa8;
  EqMatcher<unsigned_long_long> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<unsigned_long_long>::MatcherBase
            ((MatcherBase<unsigned_long_long> *)0x154f8d);
  (in_RDI->super_MatcherBase<unsigned_long_long>)._vptr_MatcherBase =
       (_func_int **)&PTR__Matcher_002673f0;
  Eq<unsigned_long_long>((unsigned_long_long)in_stack_ffffffffffffffa8);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=(in_RDI,in_stack_ffffffffffffffa8);
  ~Matcher((Matcher<unsigned_long_long> *)0x154fe3);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }